

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit_p.h
# Opt level: O3

void __thiscall QTextEditPrivate::sendControlEvent(QTextEditPrivate *this,QEvent *e)

{
  QWidgetTextControl *this_00;
  QScrollBar *this_01;
  LayoutDirection LVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetTextControl *)this->control;
  LVar1 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_01 = (this->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar1 == RightToLeft) {
    iVar2 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
    iVar3 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar2 = iVar2 - iVar3;
  }
  else {
    iVar2 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
  }
  iVar3 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  local_38.yp = (qreal)iVar3;
  local_38.xp = (double)iVar2;
  QWidgetTextControl::processEvent
            (this_00,e,&local_38,(this->super_QAbstractScrollAreaPrivate).viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void sendControlEvent(QEvent *e)
    { control->processEvent(e, QPointF(horizontalOffset(), verticalOffset()), viewport); }